

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

int stbi_info_from_memory(stbi_uc *buffer,int len,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context s;
  stbi__context local_e0;
  
  local_e0.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_e0.read_from_callbacks = 0;
  local_e0.callback_already_read = 0;
  local_e0.img_buffer_end = buffer + len;
  local_e0.img_buffer = buffer;
  local_e0.img_buffer_original = buffer;
  local_e0.img_buffer_original_end = local_e0.img_buffer_end;
  iVar1 = stbi__info_main(&local_e0,x,y,comp);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_memory(stbi_uc const *buffer, int len, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_mem(&s,buffer,len);
   return stbi__info_main(&s,x,y,comp);
}